

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void aom_highbd_comp_mask_upsampled_pred
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred8,
               uint8_t *pred8,int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref8,
               int ref_stride,uint8_t *mask,int mask_stride,int invert_mask,int bd,int subpel_search
               )

{
  uint8_t *in_R9;
  uint8_t *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  uint8_t *in_stack_00000040;
  uint8_t *in_stack_0000a1d8;
  MV *in_stack_0000a1e0;
  int in_stack_0000a1e8;
  int in_stack_0000a1ec;
  AV1Common *in_stack_0000a1f0;
  MACROBLOCKD *in_stack_0000a1f8;
  int in_stack_0000a2d0;
  int in_stack_0000a2d8;
  int in_stack_0000a2e0;
  int in_stack_0000a2e8;
  uint8_t *in_stack_0000a2f0;
  int in_stack_0000a2f8;
  int in_stack_0000a300;
  int in_stack_0000a308;
  
  aom_highbd_upsampled_pred_sse2
            (in_stack_0000a1f8,in_stack_0000a1f0,in_stack_0000a1ec,in_stack_0000a1e8,
             in_stack_0000a1e0,in_stack_0000a1d8,in_stack_0000a2d0,in_stack_0000a2d8,
             in_stack_0000a2e0,in_stack_0000a2e8,in_stack_0000a2f0,in_stack_0000a2f8,
             in_stack_0000a300,in_stack_0000a308);
  (*aom_highbd_comp_mask_pred)
            (in_R9,in_stack_00000008,in_stack_00000010,in_stack_00000018,in_R9,in_stack_00000010,
             in_stack_00000040,(int)comp_pred8,(int)mv);
  return;
}

Assistant:

void aom_highbd_comp_mask_upsampled_pred(
    MACROBLOCKD *xd, const struct AV1Common *const cm, int mi_row, int mi_col,
    const MV *const mv, uint8_t *comp_pred8, const uint8_t *pred8, int width,
    int height, int subpel_x_q3, int subpel_y_q3, const uint8_t *ref8,
    int ref_stride, const uint8_t *mask, int mask_stride, int invert_mask,
    int bd, int subpel_search) {
  aom_highbd_upsampled_pred(xd, cm, mi_row, mi_col, mv, comp_pred8, width,
                            height, subpel_x_q3, subpel_y_q3, ref8, ref_stride,
                            bd, subpel_search);
  aom_highbd_comp_mask_pred(comp_pred8, pred8, width, height, comp_pred8, width,
                            mask, mask_stride, invert_mask);
}